

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_dxil_builtins.cpp
# Opt level: O0

bool dxil_spv::dxil_instruction_has_side_effects(CallInst *instruction)

{
  bool bVar1;
  TypeID TVar2;
  Type *this;
  bool local_1d;
  uint32_t local_1c;
  bool ret;
  CallInst *pCStack_18;
  uint32_t opcode;
  CallInst *instruction_local;
  
  pCStack_18 = instruction;
  bVar1 = get_constant_operand(&instruction->super_Instruction,0,&local_1c);
  if (bVar1) {
    this = LLVMBC::Value::getType((Value *)pCStack_18);
    TVar2 = LLVMBC::Type::getTypeID(this);
    if (TVar2 == VoidTyID) {
      instruction_local._7_1_ = true;
    }
    else {
      switch(local_1c) {
      case 5:
      case 0x43:
      case 0x45:
      case 0x46:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x52:
      case 0x61:
      case 0x62:
      case 99:
      case 0x6a:
      case 0x8c:
      case 0x9b:
      case 0x9c:
      case 0x9d:
      case 0x9e:
      case 0x9f:
      case 0xa8:
      case 0xa9:
      case 0xab:
      case 0xac:
      case 0xad:
      case 0xae:
      case 0xaf:
      case 0xb0:
      case 0xb1:
      case 0xb3:
      case 0xb4:
      case 0xb5:
      case 0xb6:
      case 0xb7:
      case 0xe1:
        local_1d = true;
        break;
      default:
        local_1d = false;
      }
      instruction_local._7_1_ = local_1d;
    }
  }
  else {
    instruction_local._7_1_ = false;
  }
  return instruction_local._7_1_;
}

Assistant:

bool dxil_instruction_has_side_effects(const llvm::CallInst *instruction)
{
	uint32_t opcode;
	if (!get_constant_operand(instruction, 0, &opcode))
		return false;

	if (instruction->getType()->getTypeID() == llvm::Type::TypeID::VoidTyID)
		return true;

	bool ret;

	// Most of these are covered by the void check, but be exhaustive for completeness.
	switch (DXIL::Op(opcode))
	{
	case DXIL::Op::StoreOutput:
	case DXIL::Op::TextureStore:
	case DXIL::Op::BufferStore:
	case DXIL::Op::BufferUpdateCounter:
	case DXIL::Op::AtomicBinOp:
	case DXIL::Op::AtomicCompareExchange:
	case DXIL::Op::Barrier:
	case DXIL::Op::Discard:
	case DXIL::Op::EmitStream:
	case DXIL::Op::CutStream:
	case DXIL::Op::EmitThenCutStream:
	case DXIL::Op::StorePatchConstant:
	case DXIL::Op::RawBufferStore:
	case DXIL::Op::IgnoreHit:
	case DXIL::Op::AcceptHitAndEndSearch:
	case DXIL::Op::TraceRay:
	case DXIL::Op::ReportHit:
	case DXIL::Op::CallShader:
	case DXIL::Op::SetMeshOutputCounts:
	case DXIL::Op::EmitIndices:
	case DXIL::Op::StoreVertexOutput:
	case DXIL::Op::StorePrimitiveOutput:
	case DXIL::Op::DispatchMesh:
	case DXIL::Op::WriteSamplerFeedback:
	case DXIL::Op::WriteSamplerFeedbackBias:
	case DXIL::Op::WriteSamplerFeedbackLevel:
	case DXIL::Op::WriteSamplerFeedbackGrad:
	case DXIL::Op::RayQuery_TraceRayInline:
	case DXIL::Op::RayQuery_Proceed:
	case DXIL::Op::RayQuery_Abort:
	case DXIL::Op::RayQuery_CommitNonOpaqueTriangleHit:
	case DXIL::Op::RayQuery_CommitProceduralPrimitiveHit:
	case DXIL::Op::TextureStoreSample:
		ret = true;
		break;

	default:
		ret = false;
		break;
	}

	return ret;
}